

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_ml_basic_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  reference pvVar4;
  error_info *__str;
  error_type *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  error_info *v;
  basic_value<toml::type_config> *v_00;
  string_format_info fmt;
  string *this_00;
  _Alloc_hider this_01;
  size_type sStack_510;
  string str;
  string_type val;
  string_type local_4b0;
  location loc2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  string local_430;
  string local_410;
  sequence local_3f0;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  esc;
  region reg;
  location local_2a0;
  location first;
  region local_210;
  error_info local_1a8;
  basic_value<toml::type_config> local_150;
  error_info local_88;
  
  location::location(&first,loc);
  syntax::ml_basic_string((sequence *)&esc,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)&esc,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &esc.field_1.succ_);
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"toml::parse_ml_basic_string: invalid string format",
               (allocator<char> *)&str);
    syntax::ml_basic_string((sequence *)&loc2,&ctx->toml_spec_);
    location::location(&local_2a0,loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"",(allocator<char> *)&val);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)&esc,&local_410,(sequence *)&loc2,&local_2a0,&local_430);
    err<toml::error_info>((failure<toml::error_info> *)&local_88,(error_info *)&esc);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_88);
    error_info::~error_info(&local_88);
    error_info::~error_info((error_info *)&esc);
    std::__cxx11::string::~string((string *)&local_430);
    location::~location(&local_2a0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&loc2.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    this_00 = &local_410;
    goto LAB_002f8193;
  }
  region::as_string_abi_cxx11_(&str,&reg);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,3);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
             str._M_string_length - 3,3);
  fmt.fmt = multiline_basic;
  fmt.start_with_newline = false;
  if (str._M_string_length != 0) {
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&str,0);
    if (*pvVar4 == '\n') {
      sStack_510 = 1;
    }
    else {
      if (((str._M_string_length < 2) ||
          (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::at(&str,0), *pvVar4 != '\r')) ||
         (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   at(&str,1), *pvVar4 != '\n')) goto LAB_002f7f12;
      sStack_510 = 2;
    }
    fmt.fmt = multiline_basic;
    fmt.start_with_newline = true;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,
               sStack_510);
  }
LAB_002f7f12:
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  val.field_2._M_local_buf[0] = '\0';
  this_01._M_p = str._M_dataplus._M_p;
  while( true ) {
    sVar2 = val._M_string_length;
    if (this_01._M_p == str._M_dataplus._M_p + str._M_string_length) break;
    if ((detail)*this_01._M_p == (detail)0x5c) {
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&esc,(detail *)this_01._M_p,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(str._M_dataplus._M_p + str._M_string_length),in_RCX);
      make_temporary_location(&loc2,(string *)&esc);
      std::__cxx11::string::~string((string *)&esc);
      syntax::escaped_newline(&local_3f0,&ctx->toml_spec_);
      sequence::scan((region *)&esc,&local_3f0,&loc2);
      lVar1 = CONCAT71(esc._1_7_,esc.is_ok_);
      region::~region((region *)&esc);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_3f0.others_);
      if (lVar1 == 0) {
        parse_escape_sequence<toml::type_config>(&esc,&loc2,ctx);
        bVar3 = esc.is_ok_;
        if (esc.is_ok_ == false) {
          this = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                 ::unwrap_err(&esc,(source_location)0x45b100);
          err<toml::error_info&>((failure<toml::error_info> *)&local_1a8,(toml *)this,v);
          __str = &local_1a8;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_1a8);
          error_info::~error_info(&local_1a8);
        }
        else {
          __str = (error_info *)
                  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  ::unwrap(&esc,(source_location)0x45b118);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
          this_01._M_p = this_01._M_p + loc2.location_;
        }
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::cleanup(&esc,(EVP_PKEY_CTX *)__str);
        if (bVar3 == false) {
          location::~location(&loc2);
          goto LAB_002f8184;
        }
      }
      else {
        this_01._M_p = this_01._M_p + loc2.location_;
      }
      location::~location(&loc2);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                *this_01._M_p);
      this_01._M_p = this_01._M_p + 1;
    }
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p == &val.field_2) {
    local_4b0.field_2._8_8_ = val.field_2._8_8_;
  }
  else {
    local_4b0._M_dataplus._M_p = val._M_dataplus._M_p;
  }
  local_4b0.field_2._M_allocated_capacity._1_7_ = val.field_2._M_allocated_capacity._1_7_;
  local_4b0.field_2._M_local_buf[0] = val.field_2._M_local_buf[0];
  val._M_string_length = 0;
  local_4b0._M_string_length = sVar2;
  val.field_2._M_local_buf[0] = '\0';
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  val._M_dataplus._M_p = (pointer)&val.field_2;
  region::region(&local_210,&reg);
  basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)&esc,&local_4b0,fmt,&local_448,&local_210);
  ok<toml::basic_value<toml::type_config>>
            ((success<toml::basic_value<toml::type_config>_> *)&local_150,(toml *)&esc,v_00);
  result<toml::basic_value<toml::type_config>,_toml::error_info>::result
            (__return_storage_ptr__,(success_type *)&local_150);
  basic_value<toml::type_config>::~basic_value(&local_150);
  basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&esc);
  region::~region(&local_210);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_448);
  std::__cxx11::string::~string((string *)&local_4b0);
LAB_002f8184:
  std::__cxx11::string::~string((string *)&val);
  this_00 = &str;
LAB_002f8193:
  std::__cxx11::string::~string((string *)this_00);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_ml_basic_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    string_format_info fmt;
    fmt.fmt = string_format::multiline_basic;

    auto reg = syntax::ml_basic_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_ml_basic_string: "
            "invalid string format",
            syntax::ml_basic_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    // we already checked that it starts with """ and ends with """.
    assert(str.substr(0, 3) == "\"\"\"");
    str.erase(0, 3);

    assert(str.size() >= 3);
    assert(str.substr(str.size()-3, 3) == "\"\"\"");
    str.erase(str.size()-3, 3);

    // the first newline just after """ is trimmed
    if(str.size() >= 1 && str.at(0) == '\n')
    {
        str.erase(0, 1);
        fmt.start_with_newline = true;
    }
    else if(str.size() >= 2 && str.at(0) == '\r' && str.at(1) == '\n')
    {
        str.erase(0, 2);
        fmt.start_with_newline = true;
    }

    using string_type = typename basic_value<TC>::string_type;
    string_type val;
    {
        auto iter = str.cbegin();
        while(iter != str.cend())
        {
            if(*iter == '\\') // remove whitespaces around escaped-newline
            {
                // we assume that the string is not too long to copy
                auto loc2 = make_temporary_location(make_string(iter, str.cend()));
                if(syntax::escaped_newline(spec).scan(loc2).is_ok())
                {
                    std::advance(iter, loc2.get_location()); // skip escaped newline and indent
                    // now iter points non-WS char
                    assert(iter == str.end() || (*iter != ' ' && *iter != '\t'));
                }
                else // normal escape seq.
                {
                    auto esc = parse_escape_sequence(loc2, ctx);

                    // syntax does not check its value. the unicode codepoint may be
                    // invalid, e.g. out-of-bound, [0xD800, 0xDFFF]
                    if(esc.is_err())
                    {
                        return err(esc.unwrap_err());
                    }

                    val += esc.unwrap();
                    std::advance(iter, loc2.get_location());
                }
            }
            else // we already checked the syntax. we don't need to check it again.
            {
                val += static_cast<typename string_type::value_type>(*iter);
                ++iter;
            }
        }
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}